

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O3

bool __thiscall Am_Inter_Location::Is_Zero_Size(Am_Inter_Location *this)

{
  Am_Inter_Location_Data *pAVar1;
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  if (pAVar1->as_line == true) {
    if (((pAVar1->data).rect.left != (pAVar1->data).rect.width) ||
       ((pAVar1->data).rect.top != (pAVar1->data).rect.height)) {
      return false;
    }
  }
  else if ((0 < (pAVar1->data).rect.width) && (0 < (pAVar1->data).rect.height)) {
    return false;
  }
  return true;
}

Assistant:

bool
Am_Inter_Location::Is_Zero_Size() const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (data->as_line) {
    if (data->data.line.x1 == data->data.line.x2 &&
        data->data.line.y1 == data->data.line.y2)
      return true;
  } else {
    if (data->data.rect.width <= 0 || data->data.rect.height <= 0)
      return true;
  }
  return false;
}